

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O3

int __thiscall glslang::TPpContext::CPPinclude(TPpContext *this,TPpToken *ppToken)

{
  _Map_pointer pppIVar1;
  TInputScanner *pTVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  IncludeResult *includedFile;
  undefined4 extraout_var_00;
  ostream *poVar7;
  TokenizableIncludeFile *this_00;
  char delimit;
  char *pcVar8;
  char *pcVar9;
  TParseContextBase *pTVar10;
  _func_int **pp_Var11;
  bool bVar12;
  string filename;
  TSourceLoc directiveLoc;
  ostringstream prologue;
  ostringstream epilogue;
  long *local_398 [2];
  long local_388 [2];
  TSourceLoc local_378;
  string local_360;
  string local_340;
  long *local_320 [2];
  long local_310 [12];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  undefined4 extraout_var;
  
  local_378.column = (ppToken->loc).column;
  local_378._20_4_ = *(undefined4 *)&(ppToken->loc).field_0x14;
  local_378.name = (ppToken->loc).name;
  local_378.string = (ppToken->loc).string;
  local_378.line = (ppToken->loc).line;
  do {
    do {
      iVar3 = (*(this->inputStack).
                super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    } while (iVar3 == 9);
  } while (iVar3 == 0x20);
  if (iVar3 == 0x3c) {
    delimit = '>';
LAB_004417b7:
    iVar4 = scanHeaderName(this,ppToken,delimit);
  }
  else {
    if (iVar3 == 0x22) {
      delimit = '\"';
      goto LAB_004417b7;
    }
    (*(this->inputStack).
      super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[4])();
    iVar4 = scanToken(this,ppToken);
  }
  if (iVar4 != 0xa1) {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,&local_378,"must be followed by a header name","#include","");
    return iVar4;
  }
  local_398[0] = local_388;
  sVar6 = strlen(ppToken->name);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_398,ppToken->name,ppToken->name + sVar6);
  iVar4 = scanToken(this,ppToken);
  if (iVar4 != 10) {
    if (iVar4 == -1) {
      pTVar10 = this->parseContext;
      pp_Var11 = (pTVar10->super_TParseVersions)._vptr_TParseVersions;
      pcVar8 = "expected newline after header name:";
    }
    else {
      pTVar10 = this->parseContext;
      pp_Var11 = (pTVar10->super_TParseVersions)._vptr_TParseVersions;
      pcVar8 = "extra content after header name:";
    }
    (*pp_Var11[0x2f])(pTVar10,ppToken,pcVar8,"#include","%s",local_398[0]);
    goto LAB_00441926;
  }
  if (iVar3 == 0x3c) {
LAB_00441950:
    includedFile = (IncludeResult *)0x0;
LAB_00441953:
    (*this->includer->_vptr_Includer[2])(this->includer,includedFile);
    pppIVar1 = (this->includeStack).c.
               super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    iVar3 = (**this->includer->_vptr_Includer)
                      (this->includer,local_398[0],(this->currentSourceFile)._M_dataplus._M_p,
                       ((long)(this->includeStack).c.
                              super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)(this->includeStack).c.
                              super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                       ((long)(this->includeStack).c.
                              super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)(this->includeStack).c.
                              super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                       ((((ulong)((long)pppIVar1 -
                                 (long)(this->includeStack).c.
                                       super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
                       + (ulong)(pppIVar1 == (_Map_pointer)0x0)) * 0x40 + 1);
    includedFile = (IncludeResult *)CONCAT44(extraout_var_00,iVar3);
    if (includedFile == (IncludeResult *)0x0) {
      pcVar8 = "Could not process include directive";
      pcVar9 = "";
    }
    else {
      if ((includedFile->headerName)._M_string_length != 0) goto LAB_004419e0;
      pcVar8 = includedFile->headerData;
      pcVar9 = pcVar8 + includedFile->headerLength;
    }
    local_320[0] = local_310;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,pcVar8,pcVar9);
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,&local_378,local_320[0],"#include","for header name: %s",
               local_398[0]);
    (*this->includer->_vptr_Includer[2])(this->includer,includedFile);
    if (local_320[0] != local_310) {
      operator_delete(local_320[0],local_310[0] + 1);
    }
  }
  else {
    pppIVar1 = (this->includeStack).c.
               super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    iVar3 = (*this->includer->_vptr_Includer[1])
                      (this->includer,local_398[0],(this->currentSourceFile)._M_dataplus._M_p,
                       ((long)(this->includeStack).c.
                              super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)(this->includeStack).c.
                              super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                       ((long)(this->includeStack).c.
                              super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)(this->includeStack).c.
                              super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                       ((((ulong)((long)pppIVar1 -
                                 (long)(this->includeStack).c.
                                       super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
                       + (ulong)(pppIVar1 == (_Map_pointer)0x0)) * 0x40 + 1);
    includedFile = (IncludeResult *)CONCAT44(extraout_var,iVar3);
    if (includedFile == (IncludeResult *)0x0) goto LAB_00441950;
    if ((includedFile->headerName)._M_string_length == 0) goto LAB_00441953;
LAB_004419e0:
    if ((includedFile->headerData == (char *)0x0) || (includedFile->headerLength == 0)) {
      (*this->includer->_vptr_Includer[2])(this->includer,includedFile);
    }
    else {
      uVar5 = (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x39])();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"#line ",6);
      poVar7 = std::ostream::_M_insert<bool>(SUB81((ostringstream *)local_320,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(includedFile->headerName)._M_dataplus._M_p,
                          (includedFile->headerName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
      bVar12 = includedFile->headerData[includedFile->headerLength - 1] != '\n';
      pcVar8 = "";
      if (bVar12) {
        pcVar8 = "\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,(ulong)bVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#line ",6);
      poVar7 = (ostream *)std::ostream::operator<<(local_1a8,(uVar5 & 0xff) + local_378.line);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      TSourceLoc::getStringNameOrNum_abi_cxx11_(&local_360,&local_378,true);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_360._M_dataplus._M_p,local_360._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      this_00 = (TokenizableIncludeFile *)operator_new(0x118);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      TokenizableIncludeFile::TokenizableIncludeFile
                (this_00,&local_378,&local_360,includedFile,&local_340,this);
      pushInput(this,(tInput *)this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      TIntermediate::addIncludeText
                ((this->parseContext->super_TParseVersions).intermediate,
                 (includedFile->headerName)._M_dataplus._M_p,includedFile->headerData,
                 includedFile->headerLength);
      pTVar2 = (this->parseContext->super_TParseVersions).currentScanner;
      (pTVar2->logicalSourceLoc).column = 0;
      iVar3 = pTVar2->numSources + -1;
      if (pTVar2->currentSource <= iVar3) {
        iVar3 = pTVar2->currentSource;
      }
      pTVar2->loc[iVar3].column = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base(local_2b0);
    }
  }
LAB_00441926:
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  return iVar4;
}

Assistant:

int TPpContext::CPPinclude(TPpToken* ppToken)
{
    const TSourceLoc directiveLoc = ppToken->loc;
    bool startWithLocalSearch = true; // to additionally include the extra "" paths
    int token;

    // Find the first non-whitespace char after #include
    int ch = getChar();
    while (ch == ' ' || ch == '\t') {
        ch = getChar();
    }
    if (ch == '<') {
        // <header-name> style
        startWithLocalSearch = false;
        token = scanHeaderName(ppToken, '>');
    } else if (ch == '"') {
        // "header-name" style
        token = scanHeaderName(ppToken, '"');
    } else {
        // unexpected, get the full token to generate the error
        ungetChar();
        token = scanToken(ppToken);
    }

    if (token != PpAtomConstString) {
        parseContext.ppError(directiveLoc, "must be followed by a header name", "#include", "");
        return token;
    }

    // Make a copy of the name because it will be overwritten by the next token scan.
    const std::string filename = ppToken->name;

    // See if the directive was well formed
    token = scanToken(ppToken);
    if (token != '\n') {
        if (token == EndOfInput)
            parseContext.ppError(ppToken->loc, "expected newline after header name:", "#include", "%s", filename.c_str());
        else
            parseContext.ppError(ppToken->loc, "extra content after header name:", "#include", "%s", filename.c_str());
        return token;
    }

    // Process well-formed directive

    // Find the inclusion, first look in "Local" ("") paths, if requested,
    // otherwise, only search the "System" (<>) paths.
    TShader::Includer::IncludeResult* res = nullptr;
    if (startWithLocalSearch)
        res = includer.includeLocal(filename.c_str(), currentSourceFile.c_str(), includeStack.size() + 1);
    if (res == nullptr || res->headerName.empty()) {
        includer.releaseInclude(res);
        res = includer.includeSystem(filename.c_str(), currentSourceFile.c_str(), includeStack.size() + 1);
    }

    // Process the results
    if (res != nullptr && !res->headerName.empty()) {
        if (res->headerData != nullptr && res->headerLength > 0) {
            // path for processing one or more tokens from an included header, hand off 'res'
            const bool forNextLine = parseContext.lineDirectiveShouldSetNextLine();
            std::ostringstream prologue;
            std::ostringstream epilogue;
            prologue << "#line " << forNextLine << " " << "\"" << res->headerName << "\"\n";
            epilogue << (res->headerData[res->headerLength - 1] == '\n'? "" : "\n") <<
                "#line " << directiveLoc.line + forNextLine << " " << directiveLoc.getStringNameOrNum() << "\n";
            pushInput(new TokenizableIncludeFile(directiveLoc, prologue.str(), res, epilogue.str(), this));
            parseContext.intermediate.addIncludeText(res->headerName.c_str(), res->headerData, res->headerLength);
            // There's no "current" location anymore.
            parseContext.setCurrentColumn(0);
        } else {
            // things are okay, but there is nothing to process
            includer.releaseInclude(res);
        }
    } else {
        // error path, clean up
        std::string message =
            res != nullptr ? std::string(res->headerData, res->headerLength)
                           : std::string("Could not process include directive");
        parseContext.ppError(directiveLoc, message.c_str(), "#include", "for header name: %s", filename.c_str());
        includer.releaseInclude(res);
    }

    return token;
}